

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

bool __thiscall QWidgetPrivate::setScreen(QWidgetPrivate *this,QScreen *screen)

{
  QWExtra *pQVar1;
  tuple<QTLWExtra_*,_std::default_delete<QTLWExtra>_> tVar2;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var3;
  int *piVar4;
  QScreen *pQVar5;
  undefined8 uVar6;
  
  if ((screen != (QScreen *)0x0) &&
     ((*(byte *)(*(long *)(*(long *)&this->field_0x8 + 0x20) + 0xc) & 1) != 0)) {
    pQVar1 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if ((pQVar1 == (QWExtra *)0x0) ||
       ((tVar2.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
         super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
              *(_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_> *)
               &(pQVar1->topextra)._M_t.
                super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>,
        tVar2.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
        super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl ==
        (_Head_base<0UL,_QTLWExtra_*,_false>)0x0 ||
        (*(long *)((long)tVar2.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                         super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x20) == 0)))) {
      pQVar5 = (QScreen *)0x0;
    }
    else {
      pQVar5 = (QScreen *)QWindow::screen();
    }
    if (pQVar5 != screen) {
      createTLExtra(this);
      _Var3.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
      super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
      super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
           (((this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
           super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
      uVar6 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)screen);
      piVar4 = *(int **)((long)_Var3.
                               super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                               super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb8);
      *(undefined8 *)
       ((long)_Var3.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
              super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
              super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb8) = uVar6;
      *(QScreen **)
       ((long)_Var3.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
              super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
              super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xc0) = screen;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          operator_delete(piVar4);
        }
      }
      pQVar1 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t
               .super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
      if (pQVar1 == (QWExtra *)0x0) {
        return true;
      }
      tVar2.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
      super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_> *)
            &(pQVar1->topextra)._M_t.
             super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
      if (tVar2.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
          super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl ==
          (_Head_base<0UL,_QTLWExtra_*,_false>)0x0) {
        return true;
      }
      pQVar5 = *(QScreen **)
                ((long)tVar2.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                       super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x20);
      if (pQVar5 == (QScreen *)0x0) {
        return true;
      }
      QWindow::setScreen(pQVar5);
      return true;
    }
  }
  return false;
}

Assistant:

bool QWidgetPrivate::setScreen(QScreen *screen)
{
    Q_Q(QWidget);
    if (!screen || !q->isWindow())
        return false;
    const QScreen *currentScreen = windowHandle() ? windowHandle()->screen() : nullptr;
    if (currentScreen != screen) {
        topData()->initialScreen = screen;
        if (windowHandle())
            windowHandle()->setScreen(screen);
        return true;
    }
    return false;
}